

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void send_msg(int sock)

{
  bool bVar1;
  string name_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while( true ) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&msg_abi_cxx11_);
    bVar1 = std::operator==(&msg_abi_cxx11_,"Quit");
    if (bVar1) break;
    bVar1 = std::operator==(&msg_abi_cxx11_,"quit");
    if (bVar1) break;
    std::operator+(&local_50,&name_abi_cxx11_," ");
    std::operator+(&local_70,&local_50,&msg_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    send(sock,local_70._M_dataplus._M_p,local_70._M_string_length + 1,0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  close(sock);
  exit(0);
}

Assistant:

void send_msg(int sock){
    while(1){
        getline(std::cin, msg);
        if (msg == "Quit"|| msg == "quit"){
            close(sock);
            exit(0);
        }
        // 生成消息格式（[name] massage）
        std::string name_msg = name + " " + msg;
        send(sock, name_msg.c_str(), name_msg.length() + 1, 0);
    }
}